

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  ulong uVar8;
  int lodOffsNdx;
  long lVar9;
  int y;
  int z;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar42;
  float fVar43;
  uint uVar45;
  float fVar46;
  undefined1 auVar44 [16];
  Texture2DArrayView TVar47;
  Vector<bool,_4> res;
  Vec4 resPix;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec2 lodBounds;
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture2DArrayView src;
  Vec2 clampedLod;
  float local_2c8;
  float local_2c4;
  undefined1 local_2b8 [16];
  Vec2 local_2a8;
  float local_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  Vec4 local_278;
  float local_268 [8];
  float local_248 [6];
  PixelBufferAccess *local_230;
  ReferenceParams *local_228;
  ulong local_220;
  float local_218;
  undefined8 local_214;
  float local_20c;
  float local_208;
  float local_204;
  undefined1 local_1f8 [8];
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  float local_1e8;
  float fStack_1e4;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  Sampler *local_168;
  ConstPixelBufferAccess *local_160;
  Vec3 local_158;
  float local_148;
  float fStack_144;
  float afStack_140 [2];
  undefined8 local_138;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_128;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  Texture2DArrayView local_d8;
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  float local_58 [8];
  tcu local_38 [8];
  undefined1 auVar32 [16];
  
  local_1e8 = 0.0;
  fStack_1e4 = 0.0;
  uStack_1e0 = 0;
  local_128.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = &sampleParams->sampler;
  local_230 = errorMask;
  local_160 = reference;
  TVar47 = tcu::getEffectiveTextureView(baseView,&local_128,local_168);
  local_d8.m_levels = TVar47.m_levels;
  local_d8.m_numLevels = TVar47.m_numLevels;
  local_218 = *texCoord;
  local_248[0] = texCoord[1];
  local_214._0_4_ = texCoord[3];
  local_214._4_4_ = texCoord[6];
  local_20c = texCoord[9];
  local_248[1] = texCoord[4];
  local_248[2] = texCoord[7];
  local_248[3] = texCoord[10];
  local_268[0] = texCoord[2];
  local_268[1] = texCoord[5];
  local_268[2] = texCoord[8];
  local_268[3] = texCoord[0xb];
  if (0 < local_d8.m_numLevels) {
    uVar2 = *(undefined8 *)((local_d8.m_levels)->m_size).m_data;
    local_1e8 = (float)(int)uVar2;
    fStack_1e4 = (float)(int)((ulong)uVar2 >> 0x20);
    uStack_1e0 = 0;
  }
  fVar37 = (float)(result->m_size).m_data[0];
  fVar38 = (float)(result->m_size).m_data[1];
  local_148 = (sampleParams->super_RenderParams).w.m_data[0];
  fStack_144 = (sampleParams->super_RenderParams).w.m_data[1];
  afStack_140[0] = (sampleParams->super_RenderParams).w.m_data[2];
  afStack_140[1] = (sampleParams->super_RenderParams).w.m_data[3];
  local_138 = CONCAT44(fStack_144,afStack_140[0]);
  _local_1f8 = ZEXT816(0);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    _local_1f8 = ZEXT416((uint)(sampleParams->super_RenderParams).bias);
  }
  local_58[0] = -1.0;
  local_58[1] = 0.0;
  local_58[2] = 1.0;
  local_58[3] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = -1.0;
  local_58[6] = 0.0;
  local_58[7] = 1.0;
  local_2b8._0_4_ = 0xff00ff00;
  local_268[4] = local_268[2];
  local_268[5] = local_268[1];
  local_248[4] = local_248[2];
  local_248[5] = local_248[1];
  local_208 = local_214._4_4_;
  local_204 = (float)local_214;
  tcu::RGBA::toVec((RGBA *)local_2b8);
  tcu::clear(local_230,&local_278);
  if ((result->m_size).m_data[1] < 1) {
    iVar7 = 0;
  }
  else {
    local_1f8._4_4_ = local_1f8._0_4_;
    uStack_1f0 = local_1f8._0_4_;
    uStack_1ec = local_1f8._0_4_;
    local_f8._4_4_ = fStack_1e4;
    local_f8._0_4_ = fStack_1e4;
    local_f8._8_4_ = fStack_1e4;
    local_f8._12_4_ = fStack_1e4;
    iVar7 = 0;
    z = 0;
    local_228 = sampleParams;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (result->m_size).m_data[0]) {
        fVar15 = (float)z + 0.5;
        local_108 = ZEXT416((uint)(fVar15 / fVar38));
        local_29c = fVar38 - fVar15;
        local_c8 = ZEXT416((uint)(1.0 - fVar15 / fVar38));
        y = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_2b8,(int)result,y,z)
          ;
          auVar12._0_4_ =
               (float)local_2b8._0_4_ - (sampleParams->super_RenderParams).colorBias.m_data[0];
          auVar12._4_4_ =
               (float)local_2b8._4_4_ - (sampleParams->super_RenderParams).colorBias.m_data[1];
          auVar12._8_4_ =
               (float)local_2b8._8_4_ - (sampleParams->super_RenderParams).colorBias.m_data[2];
          auVar12._12_4_ =
               (float)local_2b8._12_4_ - (sampleParams->super_RenderParams).colorBias.m_data[3];
          local_278.m_data =
               (float  [4])
               divps(auVar12,*(undefined1 (*) [16])
                              (sampleParams->super_RenderParams).colorScale.m_data);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_2b8,(int)local_160,y,z);
          auVar13._0_4_ =
               (float)local_2b8._0_4_ - (sampleParams->super_RenderParams).colorBias.m_data[0];
          auVar13._4_4_ =
               (float)local_2b8._4_4_ - (sampleParams->super_RenderParams).colorBias.m_data[1];
          auVar13._8_4_ =
               (float)local_2b8._8_4_ - (sampleParams->super_RenderParams).colorBias.m_data[2];
          auVar13._12_4_ =
               (float)local_2b8._12_4_ - (sampleParams->super_RenderParams).colorBias.m_data[3];
          auVar12 = divps(auVar13,*(undefined1 (*) [16])
                                   (sampleParams->super_RenderParams).colorScale.m_data);
          auVar16._0_4_ = local_278.m_data[0] - auVar12._0_4_;
          auVar16._4_4_ = local_278.m_data[1] - auVar12._4_4_;
          auVar16._8_4_ = local_278.m_data[2] - auVar12._8_4_;
          auVar16._12_4_ = local_278.m_data[3] - auVar12._12_4_;
          uVar8 = CONCAT44(auVar16._4_4_,auVar16._0_4_);
          auVar40._0_8_ = uVar8 ^ 0x8000000080000000;
          auVar40._8_4_ = -auVar16._8_4_;
          auVar40._12_4_ = -auVar16._12_4_;
          auVar13 = maxps(auVar40,auVar16);
          auVar12 = *(undefined1 (*) [16])(lookupPrec->colorThreshold).m_data;
          auVar14._4_4_ = -(uint)(auVar13._4_4_ <= auVar12._4_4_);
          auVar14._0_4_ = -(uint)(auVar13._0_4_ <= auVar12._0_4_);
          auVar14._8_4_ = -(uint)(auVar13._8_4_ <= auVar12._8_4_);
          auVar14._12_4_ = -(uint)(auVar13._12_4_ <= auVar12._12_4_);
          auVar12 = packssdw(auVar14,auVar14);
          auVar12 = packsswb(auVar12,auVar12);
          local_2b8._0_4_ = SUB164(auVar12 & _DAT_00ac4030,0);
          if (SUB161(auVar12 & _DAT_00ac4030,0) == '\0') {
LAB_00a2435e:
            fVar10 = (float)y + 0.5;
            fVar24 = fVar10 / fVar37;
            bVar6 = 1.0 <= (float)local_108._0_4_ + fVar24;
            local_2c8 = fVar15;
            local_2c4 = fVar10;
            if (bVar6) {
              local_2c8 = local_29c;
              local_2c4 = fVar37 - fVar10;
            }
            lVar9 = (ulong)((uint)bVar6 * 4) * 3;
            fVar19 = *(float *)((long)local_248 + lVar9);
            fVar22 = *(float *)((long)local_248 + lVar9 + 4);
            fVar23 = *(float *)((long)local_248 + lVar9 + 8);
            uVar8 = *(ulong *)((long)&local_148 + lVar9);
            fVar20 = (float)uVar8;
            fStack_84 = (float)(uVar8 >> 0x20);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = *(ulong *)((long)afStack_140 + lVar9 + -4);
            uVar42 = (int)((uint)bVar6 << 0x1f) >> 0x1f;
            uVar45 = (int)((uint)bVar6 << 0x1f) >> 0x1f;
            auVar44._0_4_ = ~uVar42 & local_108._0_4_;
            auVar44._4_4_ = ~uVar45 & (uint)fVar24;
            auVar44._8_4_ = local_108._8_4_;
            auVar44._12_4_ = local_108._12_4_;
            auVar4._4_4_ = (uint)(1.0 - fVar24) & uVar45;
            auVar4._0_4_ = local_c8._0_4_ & uVar42;
            auVar4._8_8_ = 0;
            auVar44 = auVar44 | auVar4;
            fVar43 = auVar44._0_4_;
            fVar46 = auVar44._4_4_;
            fVar21 = auVar44._8_4_;
            fVar26 = auVar44._12_4_;
            fVar33 = (1.0 - fVar46) - fVar43;
            auVar12 = divps(auVar44,auVar34);
            auVar29._4_4_ = auVar12._4_4_;
            auVar29._0_4_ = auVar29._4_4_;
            auVar29._8_4_ = auVar29._4_4_;
            auVar29._12_4_ = auVar29._4_4_;
            auVar30._4_12_ = auVar29._4_12_;
            auVar30._0_4_ = auVar29._4_4_ + fVar33 / fVar20 + auVar12._0_4_;
            fVar36 = (float)*(undefined8 *)((long)&local_214 + lVar9);
            local_1a8._4_4_ = (undefined4)((ulong)*(undefined8 *)((long)&local_214 + lVar9) >> 0x20)
            ;
            auVar17._0_4_ = fVar36 * fVar43;
            auVar17._4_4_ = fVar19 * fVar33;
            auVar17._8_4_ = fVar21 * 0.0;
            auVar17._12_4_ = fVar26 * 0.0;
            fVar24 = *(float *)((long)&local_218 + lVar9);
            auVar35._0_4_ = fVar24 * fVar33;
            auVar35._4_4_ = fVar22 * fVar43;
            auVar35._8_4_ = fVar21 * 0.0;
            auVar35._12_4_ = fVar26 * 0.0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar8;
            auVar13 = divps(auVar35,auVar3);
            auVar5._4_4_ = fVar20;
            auVar5._0_4_ = fStack_84;
            auVar5._8_8_ = 0;
            auVar12 = divps(auVar17,auVar5);
            auVar39._0_4_ = (float)local_1a8._4_4_ * fVar46;
            auVar39._4_4_ = fVar23 * fVar46;
            auVar39._8_4_ = (float)local_1a8._4_4_ * fVar46;
            auVar39._12_4_ = (float)local_1a8._4_4_ * fVar46;
            fVar11 = *(float *)((long)afStack_140 + lVar9);
            auVar18._4_4_ = fVar11;
            auVar18._0_4_ = fVar11;
            auVar18._8_8_ = 0;
            auVar40 = divps(auVar39,auVar18);
            auVar41._0_4_ = auVar40._0_4_ + auVar13._0_4_ + auVar12._0_4_;
            auVar41._4_4_ = auVar40._4_4_ + auVar13._4_4_ + auVar12._4_4_;
            auVar41._8_4_ = auVar40._8_4_ + auVar13._8_4_ + auVar12._8_4_;
            auVar41._12_4_ = auVar40._12_4_ + auVar13._12_4_ + auVar12._12_4_;
            local_158.m_data[2] =
                 ((*(float *)((long)local_268 + lVar9 + 4) * fVar43) / fStack_84 +
                  (*(float *)((long)local_268 + lVar9) * fVar33) / fVar20 +
                 (*(float *)((long)local_268 + lVar9 + 8) * fVar46) / fVar11) / auVar30._0_4_;
            auVar32._0_8_ = auVar30._0_8_;
            auVar32._8_4_ = auVar29._4_4_;
            auVar32._12_4_ = auVar29._4_4_;
            auVar31._8_8_ = auVar32._8_8_;
            auVar31._4_4_ = auVar30._0_4_;
            auVar31._0_4_ = auVar30._0_4_;
            auVar12 = divps(auVar41,auVar31);
            local_158.m_data._0_8_ = auVar12._0_8_;
            fVar25 = fVar43 + -1.0;
            local_68 = ZEXT416((uint)(fVar11 * fVar37));
            local_298 = fVar11 * fVar37 * fVar43 + fVar10 * fStack_84;
            fStack_294 = (fVar36 - fVar24) * fVar11 + ((float)local_1a8._4_4_ - fVar36) * fVar20;
            local_78 = -fVar20;
            fStack_74 = -fStack_84;
            local_e8 = fVar11 * fStack_84;
            fStack_e4 = (fVar24 - (float)local_1a8._4_4_) * fStack_84;
            fStack_e0 = fStack_84 * 0.0;
            fStack_dc = fStack_84 * 0.0;
            uStack_70 = 0x80000000;
            uStack_6c = 0x80000000;
            fStack_290 = fVar21 * 0.0 + 0.0;
            fStack_28c = (float)local_1a8._4_4_ * fVar26 + (float)local_1a8._4_4_ * 0.0;
            fVar33 = (fVar37 * fVar25 + fVar10) * local_e8 + local_78 * local_298;
            local_88 = fStack_84 * fVar38;
            fVar10 = fVar20 * fStack_84 * fVar11;
            local_a8._0_4_ = fVar10 * fVar37;
            local_a8._4_4_ = fStack_84;
            local_a8._8_8_ = 0;
            fVar33 = fVar33 * fVar33;
            fVar26 = (fVar22 - fVar19) * fVar11 + (fVar23 - fVar22) * fVar20;
            fVar27 = (fVar19 - fVar23) * fStack_84;
            local_188 = ZEXT416((uint)fVar26);
            local_178 = ZEXT416((uint)fVar27);
            fVar21 = fVar46 + -1.0;
            fVar28 = (fVar38 * fVar21 + fVar15) * local_e8 -
                     (local_88 * fVar46 + fVar15 * fVar11) * fVar20;
            local_1a8._0_4_ =
                 (fVar36 - (float)local_1a8._4_4_) * fVar20 +
                 ((float)local_1a8._4_4_ - fVar24) * fStack_84;
            fVar36 = (fVar24 - fVar36) * fVar11;
            local_1a8._8_8_ = 0;
            local_98 = ZEXT416((uint)fVar36);
            fStack_1c4 = fStack_84;
            local_1c8 = fStack_84;
            fStack_1c0 = fStack_84;
            fStack_1bc = fStack_84;
            fVar24 = (fVar22 - fVar23) * fVar20 + (fVar23 - fVar19) * fStack_84;
            local_1b8 = ZEXT416((uint)fVar11);
            fVar11 = (fVar19 - fVar22) * fVar11;
            local_288 = ZEXT416((uint)fVar24);
            local_198 = ZEXT416((uint)fVar11);
            local_1d8._0_4_ = fVar10 * fVar38;
            local_1d8._4_8_ = uVar8 >> 0x20;
            local_1d8._12_4_ = 0;
            fVar28 = fVar28 * fVar28;
            fStack_80 = fStack_84;
            fStack_7c = fStack_84;
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&local_220,
                       (((float)local_a8._0_4_ * (fVar25 * fStack_e4 + fVar43 * fStack_294)) /
                       fVar33) * local_1e8,
                       (((fVar25 * fVar27 + fVar43 * fVar26) * (float)local_a8._0_4_) / fVar33) *
                       (float)local_f8._0_4_,
                       (((fVar36 * fVar21 + fVar46 * (float)local_1a8._0_4_) *
                        (float)local_1d8._0_4_) / fVar28) * local_1e8,
                       (((fVar21 * fVar11 + fVar46 * fVar24) * (float)local_1d8._0_4_) / fVar28) *
                       (float)local_f8._0_4_,lodPrec);
            local_b8 = fStack_e4;
            fStack_b4 = fStack_e4;
            fStack_b0 = fStack_e4;
            fStack_ac = fStack_e4;
            lVar9 = 0;
            local_298 = fStack_294;
            fStack_290 = fStack_294;
            fStack_28c = fStack_294;
            fVar10 = fStack_294;
            do {
              fVar11 = local_58[lVar9 * 2] + local_2c4;
              fVar19 = local_58[lVar9 * 2 + 1] + local_2c8;
              fVar36 = fVar19 / fVar38;
              fVar24 = fVar36 + -1.0;
              fVar22 = (fVar37 * fVar24 + fVar11) * local_e8 +
                       ((float)local_68._0_4_ * fVar36 + local_1c8 * fVar11) * local_78;
              fVar22 = fVar22 * fVar22;
              fVar11 = fVar11 / fVar37;
              fVar23 = fVar11 + -1.0;
              fVar19 = (fVar38 * fVar23 + fVar19) * local_e8 +
                       (local_88 * fVar11 + fVar19 * (float)local_1b8._0_4_) * local_78;
              fVar19 = fVar19 * fVar19;
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)local_2b8,
                         (((local_b8 * fVar24 + fVar10 * fVar36) * (float)local_a8._0_4_) / fVar22)
                         * local_1e8,
                         (((fVar24 * (float)local_178._0_4_ + fVar36 * (float)local_188._0_4_) *
                          (float)local_a8._0_4_) / fVar22) * (float)local_f8._0_4_,
                         ((((float)local_98._0_4_ * fVar23 + (float)local_1a8._0_4_ * fVar11) *
                          (float)local_1d8._0_4_) / fVar19) * local_1e8,
                         (((fVar23 * (float)local_198._0_4_ + fVar11 * (float)local_288._0_4_) *
                          (float)local_1d8._0_4_) / fVar19) * (float)local_f8._0_4_,lodPrec);
              fVar10 = (float)(local_220 >> 0x20);
              uVar42 = -(uint)((float)local_220 <= (float)local_2b8._0_4_);
              uVar45 = -(uint)((float)local_2b8._4_4_ <= fVar10);
              local_220 = CONCAT44(~uVar45 & local_2b8._4_4_,~uVar42 & local_2b8._0_4_) |
                          CONCAT44((uint)fVar10 & uVar45,(uint)(float)local_220 & uVar42);
              lVar9 = lVar9 + 1;
              fVar10 = local_298;
            } while (lVar9 != 4);
            local_2b8._0_4_ = (float)local_220 + (float)local_1f8._0_4_;
            local_2b8._4_4_ = (float)(local_220 >> 0x20) + (float)local_1f8._4_4_;
            local_2a8.m_data[0] = local_228->minLod;
            local_2a8.m_data[1] = local_228->maxLod;
            tcu::clampLodBounds(local_38,(Vec2 *)local_2b8,&local_2a8,lodPrec);
            bVar6 = tcu::isLookupResultValid
                              (&local_d8,local_168,lookupPrec,&local_158,(Vec2 *)local_38,&local_278
                              );
            sampleParams = local_228;
            if (!bVar6) {
              local_2a8.m_data[0] = -1.7014636e+38;
              tcu::RGBA::toVec((RGBA *)&local_2a8);
              tcu::PixelBufferAccess::setPixel(local_230,(Vec4 *)local_2b8,y,z,0);
              iVar7 = iVar7 + 1;
              sampleParams = local_228;
            }
          }
          else {
            uVar8 = 0xffffffffffffffff;
            do {
              if (uVar8 == 2) goto LAB_00a24b47;
              uVar1 = uVar8 + 1;
              lVar9 = uVar8 + 2;
              uVar8 = uVar1;
            } while (local_2b8[lVar9] != '\0');
            if (uVar1 < 3) goto LAB_00a2435e;
          }
LAB_00a24b47:
          y = y + 1;
        } while (y < (result->m_size).m_data[0]);
      }
      z = z + 1;
    } while (z < (result->m_size).m_data[1]);
  }
  if (local_128.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar7;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture2DArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DArrayView				src					= getEffectiveTextureView(baseView, srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::Vec2								srcSize				= tcu::IVec2(src.getWidth(), src.getHeight()).asFloat(); // For lod computation, thus #layers is ignored.

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize;
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize;

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize;
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize;
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}